

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<kj::_::(anonymous_namespace)::SiPair_&> __thiscall
kj::
Table<kj::_::(anonymous_namespace)::SiPair,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>>
::find<0ul,char_const(&)[6]>
          (Table<kj::_::(anonymous_namespace)::SiPair,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>>
           *this,char (*params) [7])

{
  long lVar1;
  long lVar2;
  int *piVar3;
  Maybe<kj::_::(anonymous_namespace)::SiPair_&> MVar4;
  uint in_EAX;
  undefined4 in_register_00000004;
  undefined4 extraout_var;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint *puVar9;
  ArrayPtr<const_unsigned_char> s;
  
  if (*(long *)(params + 8) != 0) {
    lVar1 = *(long *)params;
    s.size_ = 5;
    s.ptr = (uchar *)"corge";
    in_EAX = _::HashCoder::operator*((HashCoder *)&_::HASHCODER,s);
    lVar2 = *(long *)(params[6] + 6);
    uVar5 = (ulong)((int)*(ulong *)(params + 8) - 1U & in_EAX);
    uVar7 = *(uint *)(lVar2 + 4 + uVar5 * 8);
    in_register_00000004 = extraout_var;
    if (uVar7 != 0) {
      puVar9 = (uint *)(lVar2 + uVar5 * 8);
      uVar8 = 0;
      do {
        if ((((uVar7 != 1) && (*puVar9 == in_EAX)) &&
            (uVar6 = (ulong)(uVar7 - 2), *(long *)(lVar1 + 8 + uVar6 * 0x18) == 6)) &&
           (piVar3 = *(int **)(lVar1 + uVar6 * 0x18),
           (short)piVar3[1] == 0x65 && *piVar3 == 0x67726f63)) {
          uVar8 = uVar6 * 0x18 + *(long *)params;
          break;
        }
        uVar6 = uVar5 + 1;
        uVar5 = uVar6 & 0xffffffff;
        if (uVar6 == *(ulong *)(params + 8)) {
          uVar5 = uVar8;
        }
        puVar9 = (uint *)(lVar2 + uVar5 * 8);
        uVar7 = puVar9[1];
      } while (uVar7 != 0);
      goto LAB_00156957;
    }
  }
  uVar8 = 0;
LAB_00156957:
  *(ulong *)this = uVar8;
  MVar4.ptr._4_4_ = in_register_00000004;
  MVar4.ptr._0_4_ = in_EAX;
  return (Maybe<kj::_::(anonymous_namespace)::SiPair_&>)MVar4.ptr;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}